

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManPrintCone(Gia_Man_t *p,Gia_Obj_t *pObj,int *pLeaves,int nLeaves,Vec_Int_t *vNodes)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_34;
  int i;
  Vec_Int_t *vNodes_local;
  int nLeaves_local;
  int *pLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  for (local_34 = 0; local_34 < nLeaves; local_34 = local_34 + 1) {
    Vec_IntPush(vNodes,pLeaves[local_34]);
  }
  Gia_ManPrintCollect_rec(p,pObj,vNodes);
  uVar1 = Gia_ObjId(p,pObj);
  printf("GIA logic cone for node %d:\n",(ulong)uVar1);
  local_34 = 0;
  pLeaves_local = (int *)pObj;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes);
    bVar3 = false;
    if (local_34 < iVar2) {
      iVar2 = Vec_IntEntry(vNodes,local_34);
      pLeaves_local = (int *)Gia_ManObj(p,iVar2);
      bVar3 = (Gia_Obj_t *)pLeaves_local != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjPrint(p,(Gia_Obj_t *)pLeaves_local);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Gia_ManPrintCone( Gia_Man_t * p, Gia_Obj_t * pObj, int * pLeaves, int nLeaves, Vec_Int_t * vNodes )
{
    int i;
    Vec_IntClear( vNodes );
    for ( i = 0; i < nLeaves; i++ )
        Vec_IntPush( vNodes, pLeaves[i] );
    Gia_ManPrintCollect_rec( p, pObj, vNodes );
    printf( "GIA logic cone for node %d:\n", Gia_ObjId(p, pObj) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ObjPrint( p, pObj );
}